

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O0

int __thiscall LPCMStreamReader::readPacket(LPCMStreamReader *this,AVPacket *avPacket)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  int iVar3;
  int iVar4;
  CodecInfo *pCVar5;
  uchar *puVar6;
  ostream *poVar7;
  longlong lVar8;
  VodCoreException *this_00;
  long lVar9;
  double dVar10;
  string local_200;
  ostringstream local_1e0 [8];
  ostringstream ss;
  int frameLen;
  string local_58;
  int local_34;
  uint8_t *puStack_30;
  int decodeRez;
  uint8_t *frame;
  int skipBeforeBytes;
  int skipBytes;
  AVPacket *avPacket_local;
  LPCMStreamReader *this_local;
  
  avPacket->flags = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_flags;
  avPacket->stream_index =
       (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_streamIndex;
  _skipBeforeBytes = avPacket;
  avPacket_local = (AVPacket *)this;
  pCVar5 = getCodecInfo(this);
  _skipBeforeBytes->codecID = pCVar5->codecID;
  _skipBeforeBytes->codec = (BaseAbstractStreamReader *)this;
  _skipBeforeBytes->data = (uint8_t *)0x0;
  _skipBeforeBytes->size = 0;
  _skipBeforeBytes->duration = 0;
  lVar9 = (long)((this->super_SimplePacketizerReader).m_curPts *
                (this->super_SimplePacketizerReader).m_stretch) +
          (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_timeOffset;
  _skipBeforeBytes->pts = lVar9;
  _skipBeforeBytes->dts = lVar9;
  if ((this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd <
      (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos) {
    __assert_fail("m_curPos <= m_bufEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jcdr428[P]tsMuxer/tsMuxer/lpcmStreamReader.cpp"
                  ,0x304,"virtual int LPCMStreamReader::readPacket(AVPacket &)");
  }
  if ((this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos ==
      (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd) {
    return 1;
  }
  frame._4_4_ = 0;
  frame._0_4_ = 0;
  if (((this->super_SimplePacketizerReader).m_needSync & 1U) != 0) {
    puStack_30 = findFrame(this,(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                                m_curPos,
                           (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd)
    ;
    if (puStack_30 == (uint8_t *)0x0) {
      (this->super_SimplePacketizerReader).m_processedBytes =
           (int64_t)((this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd +
                    ((this->super_SimplePacketizerReader).m_processedBytes -
                    (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos))
      ;
      return 1;
    }
    local_34 = decodeFrame(this,puStack_30,
                           (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd,
                           (int *)((long)&frame + 4),(int *)&frame);
    if (local_34 == -10) {
      puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         (&(this->super_SimplePacketizerReader).m_tmpBuffer);
      memcpy(puVar6,(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos,
             (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd -
             (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos);
      (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_tmpBufferLen =
           (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd -
           (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos;
      (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos =
           (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd;
      return 1;
    }
    if (local_34 + frame._4_4_ + (int)frame < 1) {
      (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos =
           (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos + 1;
      (this->super_SimplePacketizerReader).m_processedBytes =
           (this->super_SimplePacketizerReader).m_processedBytes + 1;
      return 0;
    }
    (this->super_SimplePacketizerReader).m_processedBytes =
         (int64_t)(puStack_30 +
                  ((this->super_SimplePacketizerReader).m_processedBytes -
                  (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos));
    poVar7 = std::operator<<((ostream *)&std::cout,"Decoding ");
    pCVar5 = getCodecInfo(this);
    poVar7 = std::operator<<(poVar7,(string *)&pCVar5->displayName);
    poVar7 = std::operator<<(poVar7," stream (track ");
    poVar7 = (ostream *)
             std::ostream::operator<<
                       (poVar7,(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                               m_streamIndex);
    poVar7 = std::operator<<(poVar7,"): ");
    getStreamInfo_abi_cxx11_(&local_58,this);
    poVar7 = std::operator<<(poVar7,(string *)&local_58);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_58);
    sLastMsg = true;
    (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos = puStack_30;
    (this->super_SimplePacketizerReader).m_needSync = false;
  }
  lVar8 = llround((this->super_SimplePacketizerReader).m_curPts *
                  (this->super_SimplePacketizerReader).m_stretch);
  lVar9 = lVar8 + (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_timeOffset;
  _skipBeforeBytes->pts = lVar9;
  _skipBeforeBytes->dts = lVar9;
  puVar1 = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd;
  puVar2 = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos;
  iVar3 = getHeaderLen(this);
  if ((long)puVar1 - (long)puVar2 < (long)iVar3) {
    puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       (&(this->super_SimplePacketizerReader).m_tmpBuffer);
    memmove(puVar6,(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos,
            (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd -
            (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos);
    (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_tmpBufferLen =
         (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd -
         (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos;
    (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos =
         (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd;
    this_local._4_4_ = 1;
  }
  else {
    frame._4_4_ = 0;
    frame._0_4_ = 0;
    iVar3 = decodeFrame(this,(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                             m_curPos,
                        (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd,
                        (int *)((long)&frame + 4),(int *)&frame);
    if (iVar3 == -10) {
      puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         (&(this->super_SimplePacketizerReader).m_tmpBuffer);
      memmove(puVar6,(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos,
              (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd -
              (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos);
      (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_tmpBufferLen =
           (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd -
           (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos;
      (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos =
           (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd;
      this_local._4_4_ = 1;
    }
    else if (iVar3 + frame._4_4_ + (int)frame < 1) {
      pCVar5 = getCodecInfo(this);
      poVar7 = std::operator<<((ostream *)&std::cout,(string *)&pCVar5->displayName);
      poVar7 = std::operator<<(poVar7," bad frame detected. Resync stream.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      sLastMsg = true;
      (this->super_SimplePacketizerReader).m_needSync = true;
      this_local._4_4_ = 0;
    }
    else if ((long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd -
             (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos <
             (long)(iVar3 + frame._4_4_ + (int)frame)) {
      puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         (&(this->super_SimplePacketizerReader).m_tmpBuffer);
      memmove(puVar6,(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos,
              (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd -
              (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos);
      (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_tmpBufferLen =
           (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd -
           (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos;
      (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos =
           (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd;
      this_local._4_4_ = 1;
    }
    else {
      _skipBeforeBytes->data =
           (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos;
      _skipBeforeBytes->data = _skipBeforeBytes->data + (int)frame;
      if (this->m_curChunkLen != 0) {
        this->m_curChunkLen = this->m_curChunkLen - (long)iVar3;
      }
      if (0x8000 < iVar3) {
        std::__cxx11::ostringstream::ostringstream(local_1e0);
        poVar7 = std::operator<<((ostream *)local_1e0,"AV frame too large (");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
        std::operator<<(poVar7," bytes). Increase AV buffer.");
        this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        VodCoreException::VodCoreException(this_00,800,&local_200);
        __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      _skipBeforeBytes->size = iVar3;
      dVar10 = getFrameDuration(this);
      _skipBeforeBytes->duration = (long)dVar10;
      (this->super_SimplePacketizerReader).m_curPts =
           (double)_skipBeforeBytes->duration + (this->super_SimplePacketizerReader).m_curPts;
      SimplePacketizerReader::doMplsCorrection(&this->super_SimplePacketizerReader);
      if (((this->m_headerType == htWAVE) || (this->m_headerType == htWAVE64)) &&
         (((this->super_SimplePacketizerReader).super_AbstractStreamReader.m_demuxMode & 1U) == 0))
      {
        iVar4 = convertWavToPCM(this,_skipBeforeBytes->data,
                                _skipBeforeBytes->data + _skipBeforeBytes->size);
        _skipBeforeBytes->size = iVar4;
        _skipBeforeBytes->data = this->m_tmpFrameBuffer;
      }
      (this->super_SimplePacketizerReader).m_frameNum =
           (this->super_SimplePacketizerReader).m_frameNum + 1;
      (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos =
           (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos +
           (iVar3 + frame._4_4_ + (int)frame);
      (this->super_SimplePacketizerReader).m_processedBytes =
           (long)(iVar3 + frame._4_4_ + (int)frame) +
           (this->super_SimplePacketizerReader).m_processedBytes;
      if (this->m_frameRest == 0) {
        _skipBeforeBytes->flags =
             (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_flags + 6;
      }
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int LPCMStreamReader::readPacket(AVPacket& avPacket)
{
    avPacket.flags = m_flags;  // + AVPacket::IS_COMPLETE_FRAME | AVPacket::FORCE_NEW_FRAME;
    avPacket.stream_index = m_streamIndex;
    avPacket.codecID = getCodecInfo().codecID;
    avPacket.codec = this;
    avPacket.data = nullptr;
    avPacket.size = 0;
    avPacket.duration = 0;
    avPacket.dts = avPacket.pts = static_cast<int64_t>(m_curPts * m_stretch) + m_timeOffset;
    assert(m_curPos <= m_bufEnd);
    if (m_curPos == m_bufEnd)
        return NEED_MORE_DATA;
    int skipBytes = 0;
    int skipBeforeBytes = 0;
    if (m_needSync)
    {
        uint8_t* frame = findFrame(m_curPos, m_bufEnd);
        if (frame == nullptr)
        {
            m_processedBytes += m_bufEnd - m_curPos;
            return NEED_MORE_DATA;
        }
        const int decodeRez = decodeFrame(frame, m_bufEnd, skipBytes, skipBeforeBytes);
        if (decodeRez == NOT_ENOUGH_BUFFER)
        {
            memcpy(m_tmpBuffer.data(), m_curPos, m_bufEnd - m_curPos);
            m_tmpBufferLen = m_bufEnd - m_curPos;
            m_curPos = m_bufEnd;
            return NEED_MORE_DATA;
        }
        if (decodeRez + skipBytes + skipBeforeBytes <= 0)
        {
            m_curPos++;
            m_processedBytes++;
            return 0;
        }
        m_processedBytes += frame - m_curPos;
        LTRACE(LT_INFO, 2,
               "Decoding " << getCodecInfo().displayName << " stream (track " << m_streamIndex
                           << "): " << getStreamInfo());
        m_curPos = frame;
        m_needSync = false;
    }
    avPacket.dts = avPacket.pts = llround(m_curPts * m_stretch) + m_timeOffset;
    if (m_bufEnd - m_curPos < getHeaderLen())
    {
        memmove(m_tmpBuffer.data(), m_curPos, m_bufEnd - m_curPos);
        m_tmpBufferLen = m_bufEnd - m_curPos;
        m_curPos = m_bufEnd;
        return NEED_MORE_DATA;
    }
    skipBytes = 0;
    skipBeforeBytes = 0;
    const int frameLen = decodeFrame(m_curPos, m_bufEnd, skipBytes, skipBeforeBytes);
    if (frameLen == NOT_ENOUGH_BUFFER)
    {
        memmove(m_tmpBuffer.data(), m_curPos, m_bufEnd - m_curPos);
        m_tmpBufferLen = m_bufEnd - m_curPos;
        m_curPos = m_bufEnd;
        return NEED_MORE_DATA;
    }
    if (frameLen + skipBytes + skipBeforeBytes <= 0)
    {
        LTRACE(LT_INFO, 2, getCodecInfo().displayName << " bad frame detected. Resync stream.");
        m_needSync = true;
        return 0;
    }
    if (m_bufEnd - m_curPos < frameLen + skipBytes + skipBeforeBytes)
    {
        memmove(m_tmpBuffer.data(), m_curPos, m_bufEnd - m_curPos);
        m_tmpBufferLen = m_bufEnd - m_curPos;
        m_curPos = m_bufEnd;
        return NEED_MORE_DATA;
    }
    avPacket.data = m_curPos;
    avPacket.data += skipBeforeBytes;
    if (m_curChunkLen)
        m_curChunkLen -= frameLen;
    if (frameLen > MAX_AV_PACKET_SIZE)
        THROW(ERR_AV_FRAME_TOO_LARGE, "AV frame too large (" << frameLen << " bytes). Increase AV buffer.")
    avPacket.size = frameLen;
    avPacket.duration = static_cast<int64_t>(getFrameDuration());  // m_ptsIncPerFrame;
    m_curPts += static_cast<double>(avPacket.duration);
    doMplsCorrection();
    if ((m_headerType == LPCMHeaderType::htWAVE || m_headerType == LPCMHeaderType::htWAVE64) && !m_demuxMode)
    {
        avPacket.size = convertWavToPCM(avPacket.data, avPacket.data + avPacket.size);
        avPacket.data = m_tmpFrameBuffer;
    }

    m_frameNum++;
    if (m_frameNum % 1000 == 0)
        LTRACE(LT_DEBUG, 0, "Processed " << m_frameNum << " " << getCodecInfo().displayName << " frames");
    m_curPos += frameLen + skipBytes + skipBeforeBytes;
    m_processedBytes += frameLen + skipBytes + skipBeforeBytes;
    if (m_frameRest == 0)
        avPacket.flags = m_flags + (AVPacket::IS_COMPLETE_FRAME | AVPacket::FORCE_NEW_FRAME);
    return 0;
}